

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_http_client_sync.cpp
# Opt level: O2

void Help(char *argv0)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Usage: ");
  poVar1 = std::operator<<(poVar1,argv0);
  poVar1 = std::operator<<(poVar1," <host> <path>");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"  E.g.,");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"    ");
  poVar1 = std::operator<<(poVar1,argv0);
  poVar1 = std::operator<<(poVar1," www.boost.org /LICENSE_1_0.txt");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"    ");
  poVar1 = std::operator<<(poVar1,argv0);
  poVar1 = std::operator<<(poVar1," www.google.com /");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void Help(const char* argv0) {
  std::cout << "Usage: " << argv0 << " <host> <path>" << std::endl;
  std::cout << "  E.g.," << std::endl;
  std::cout << "    " << argv0 << " www.boost.org /LICENSE_1_0.txt" << std::endl;
  std::cout << "    " << argv0 << " www.google.com /" << std::endl;
}